

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_facade.cpp
# Opt level: O3

bool __thiscall Clasp::ClaspFacade::SolveHandle::error(SolveHandle *this)

{
  if ((this->strat_->state_).super___atomic_base<unsigned_int>._M_i == 1) {
    return false;
  }
  return (this->strat_->signal_).super___atomic_base<unsigned_int>._M_i == 0x80;
}

Assistant:

bool ClaspFacade::SolveHandle::error()              const { return ready() && strat_->error(); }